

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::find_simplex
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<int,_std::allocator<int>_> *simplex)

{
  Siblings *pSVar1;
  long *in_RDX;
  long lVar2;
  pointer local_30;
  
  lVar2 = *in_RDX;
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
  ::find((flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
          *)&local_30,
         (key_type *)
         &simplex[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish);
  if (local_30 !=
      (pointer)(simplex[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (long)simplex[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage * 8)) {
    do {
      lVar2 = lVar2 + 4;
      if (lVar2 == in_RDX[1]) goto LAB_0010b560;
      pSVar1 = (local_30->second).children_;
      if (pSVar1->parent_ != local_30->first) break;
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
              *)&local_30,(key_type *)&pSVar1->members_);
    } while (local_30 !=
             (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
             (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
  }
  local_30 = (pointer)0x0;
LAB_0010b560:
  (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)local_30;
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
}

Assistant:

Simplex_handle find_simplex(const std::vector<Vertex_handle> & simplex) const {
    Siblings const* tmp_sib = &root_;
    Dictionary_const_it tmp_dit;
    auto vi = simplex.begin();
    if constexpr (Options::contiguous_vertices && !Options::stable_simplex_handles) {
      // Equivalent to the first iteration of the normal loop
      GUDHI_CHECK(contiguous_vertices(), "non-contiguous vertices");
      Vertex_handle v = *vi++;
      if(v < 0 || v >= static_cast<Vertex_handle>(root_.members_.size()))
        return null_simplex();
      tmp_dit = root_.members_.begin() + v;
      if (vi == simplex.end())
        return tmp_dit;
      if (!has_children(tmp_dit))
        return null_simplex();
      tmp_sib = tmp_dit->second.children();
    }
    for (;;) {
      tmp_dit = tmp_sib->members_.find(*vi++);
      if (tmp_dit == tmp_sib->members_.end())
        return null_simplex();
      if (vi == simplex.end())
        return tmp_dit;
      if (!has_children(tmp_dit))
        return null_simplex();
      tmp_sib = tmp_dit->second.children();
    }
  }